

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodstocsv.cpp
# Opt level: O0

void doit(void)

{
  size_t local_20;
  size_t i;
  undefined1 auStack_10 [4];
  Periods p;
  
  printf("\"period_no\", \"weighting\"\n");
  local_20 = fread((void *)((long)&i + 4),0xc,1,_stdin);
  while (local_20 != 0) {
    printf("%d, %0.9lf\n",_auStack_10,(ulong)i._4_4_);
    local_20 = fread((void *)((long)&i + 4),0xc,1,_stdin);
  }
  return;
}

Assistant:

void doit()
{
	printf("\"period_no\", \"weighting\"\n");
	
	Periods p;
	size_t i = fread(&p, sizeof(p), 1, stdin);
	while (i != 0) {
		printf("%d, %0.9lf\n",	p.period_no, p.weighting);

		i = fread(&p, sizeof(p), 1, stdin);
    }

}